

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::AbstractDOMParser::useScanner(AbstractDOMParser *this,XMLCh *scannerName)

{
  XMLScanner *this_00;
  
  this_00 = XMLScannerResolver::resolveScanner
                      (scannerName,this->fValidator,this->fGrammarResolver,this->fMemoryManager);
  if (this_00 != (XMLScanner *)0x0) {
    XMLScanner::setParseSettings(this_00,this->fScanner);
    XMLScanner::setURIStringPool(this_00,this->fURIStringPool);
    if (this->fScanner != (XMLScanner *)0x0) {
      (*(this->fScanner->super_XMLBufferFullHandler)._vptr_XMLBufferFullHandler[1])();
    }
    this->fScanner = this_00;
  }
  return;
}

Assistant:

void AbstractDOMParser::useScanner(const XMLCh* const scannerName)
{
    XMLScanner* tempScanner = XMLScannerResolver::resolveScanner
    (
        scannerName
        , fValidator
        , fGrammarResolver
        , fMemoryManager
    );

    if (tempScanner) {

        tempScanner->setParseSettings(fScanner);
        tempScanner->setURIStringPool(fURIStringPool);
        delete fScanner;
        fScanner = tempScanner;
    }
}